

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

Boxed_Value
chaiscript::dispatch::detail::
call_func<std::__cxx11::string(*)(std::function<void()>const&),std::__cxx11::string,std::function<void()>const&>
          (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
           *sig,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
                **f,Function_Params *params,Type_Conversions_State *t_conversions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  call_func<std::__cxx11::string(*)(std::function<void()>const&),std::__cxx11::string,std::function<void()>const&,0ul>
            (&local_30);
  BVar2 = Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
                    ((Handle_Return<std::__cxx11::string> *)sig,&local_30);
  _Var1._M_pi = BVar2.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)sig;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value
      call_func(Ret (*sig)(Params...), const Callable &f, const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) {
        if constexpr (std::is_same_v<Ret, void>) {
          call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions);
          return Handle_Return<void>::handle();
        } else {
          return Handle_Return<Ret>::handle(call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions));
        }
      }